

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_response::redirect(coro_http_response *this,string *url,bool is_forever)

{
  byte in_DL;
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  allocator<char> local_a1;
  allocator<char> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_69 [5];
  content_encoding in_stack_ffffffffffffff9c;
  string *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  coro_http_response *in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> local_38 [2];
  byte local_11;
  
  local_11 = in_DL & 1;
  this_01 = local_38;
  std::__cxx11::string::string(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  add_header<char_const*,std::__cxx11::string>
            (in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(in_stack_ffffffffffffff30);
  if ((local_11 & 1) == 0) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60
              );
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_01,in_RDI);
    set_status_and_content
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string(this_00);
    std::allocator<char>::~allocator(local_69);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60
              );
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_01,in_RDI);
    set_status_and_content
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string(in_stack_ffffffffffffff30);
    std::allocator<char>::~allocator(&local_a1);
  }
  return;
}

Assistant:

void redirect(const std::string &url, bool is_forever = false) {
    add_header("Location", url);
    is_forever == false
        ? set_status_and_content(status_type::moved_temporarily, "")
        : set_status_and_content(status_type::moved_permanently, "");
  }